

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O1

int check_zero(test_state *state)

{
  int iVar1;
  
  if ((state->strm->flags & 8) == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0x55;
  }
  memset(state->ubuf,iVar1,state->buf_len);
  printf("Checking zero blocks ... ");
  iVar1 = check_block_sizes(state,0,state->id_len + 1);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int check_zero(struct test_state *state)
{
    int status;

    if (state->strm->flags & AEC_DATA_PREPROCESS)
        memset(state->ubuf, 0x55, state->buf_len);
    else
        memset(state->ubuf, 0, state->buf_len);

    printf("Checking zero blocks ... ");
    status = check_block_sizes(state, 0, state->id_len + 1);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}